

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_int_const,unsigned_int_const,unsigned_int_const>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_int,_unsigned_int,_unsigned_int>
           *__return_storage_ptr__,v10 *this,uint *args,uint *args_1,uint *args_2)

{
  uint *args_local_2;
  uint *args_local_1;
  uint *args_local;
  bool formattable_2;
  bool formattable_pointer_2;
  bool formattable_char_2;
  longlong local_b8;
  size_t local_b0;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  longlong local_88;
  size_t local_80;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  longlong local_58;
  size_t local_50;
  
  local_58._0_4_ = *(undefined4 *)this;
  local_88._0_4_ = *args;
  local_b8._0_4_ = *args_1;
  (__return_storage_ptr__->data_).args_[0].field_0.long_long_value = local_58;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_50;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_88;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_80;
  (__return_storage_ptr__->data_).args_[2].field_0.long_long_value = local_b8;
  (__return_storage_ptr__->data_).args_[2].field_0.string.size = local_b0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}